

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O2

size_t ZSTD_decompressBlock_internal
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,int frame)

{
  byte bVar1;
  byte bVar2;
  BYTE BVar3;
  BYTE *pBVar4;
  seq_t sequence;
  seq_t sequence_00;
  seq_t sequence_01;
  BIT_DStream_status BVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  BYTE *op_5;
  size_t sVar9;
  size_t sVar10;
  long lVar11;
  BYTE *pBVar12;
  byte bVar13;
  BYTE *pBVar14;
  BYTE *pBVar15;
  long *plVar16;
  ulong uVar17;
  size_t __n;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  BYTE *pBVar21;
  BYTE *pBVar22;
  ZSTD_DCtx *pZVar23;
  BYTE *ip_5;
  BYTE *pBVar24;
  BYTE *pBVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  size_t sVar29;
  BYTE *oend;
  void *srcBuffer;
  BYTE *pBVar30;
  BYTE **ppBVar31;
  long lVar32;
  BYTE *local_1c8;
  BYTE *litPtr;
  ZSTD_DCtx *local_1b0;
  BYTE *local_1a8;
  BIT_DStream_t local_1a0;
  ZSTD_fseState local_178;
  ZSTD_fseState local_168;
  ZSTD_fseState local_158;
  ulong local_148 [3];
  BYTE *local_130 [2];
  long local_120;
  BYTE *local_118;
  BYTE *local_110;
  int nbSeq;
  BYTE *local_100;
  BYTE *local_f8;
  BYTE *local_f0;
  long *local_e8;
  ulong local_e0;
  int local_d4;
  BYTE *local_d0;
  ulong local_c8;
  size_t local_c0;
  seq_t sequences [4];
  
  if (0x1ffff < srcSize) {
    return 0xffffffffffffffb8;
  }
  sVar9 = ZSTD_decodeLiteralsBlock(dctx,src,srcSize);
  if (0xffffffffffffff88 < sVar9) {
    return sVar9;
  }
  iVar7 = dctx->ddictIsCold;
  local_1b0 = dctx;
  local_1a8 = (BYTE *)dst;
  sVar10 = ZSTD_decodeSeqHeaders(dctx,&nbSeq,(void *)((long)src + sVar9),srcSize - sVar9);
  pBVar15 = local_1a8;
  if (0xffffffffffffff88 < sVar10) {
    return sVar10;
  }
  srcBuffer = (void *)((long)((long)src + sVar9) + sVar10);
  sVar10 = (srcSize - sVar9) - sVar10;
  if (iVar7 != 0) {
    local_1b0->ddictIsCold = 0;
    goto LAB_003ce196;
  }
  if (frame == 0) {
    if (nbSeq < 5) goto LAB_003ceb7a;
  }
  else if ((local_1b0->fParams).windowSize < 0x1000001 || nbSeq < 5) {
LAB_003ceb7a:
    local_1b0->ddictIsCold = 0;
    goto LAB_003ceb82;
  }
  iVar7 = 0;
  for (uVar26 = 0; bVar13 = (byte)local_1b0->OFTptr->baseValue, uVar26 >> (bVar13 & 0x1f) == 0;
      uVar26 = uVar26 + 1) {
    iVar7 = (iVar7 + 1) - (uint)(local_1b0->OFTptr[(ulong)uVar26 + 1].nbAdditionalBits < 0x17);
  }
  local_1b0->ddictIsCold = 0;
  if (6 < (uint)(iVar7 << (8 - bVar13 & 0x1f))) {
LAB_003ce196:
    pBVar24 = local_1a8 + dstCapacity;
    litPtr = local_1b0->litPtr;
    sVar9 = local_1b0->litSize;
    pBVar25 = litPtr + sVar9;
    local_1c8 = local_1a8;
    if (nbSeq != 0) {
      pBVar25 = (BYTE *)local_1b0->prefixStart;
      local_f0 = (BYTE *)local_1b0->virtualStart;
      local_130[1] = (BYTE *)local_1b0->dictEnd;
      local_1b0->fseEntropy = 1;
      for (lVar11 = -6; lVar11 != 0; lVar11 = lVar11 + 2) {
        *(ulong *)((long)local_130 + lVar11 * 4) =
             (ulong)*(uint *)((long)local_1b0->workspace + lVar11 * 2);
      }
      iVar7 = 4;
      if (nbSeq < 4) {
        iVar7 = nbSeq;
      }
      local_120 = (long)local_1a8 - (long)pBVar25;
      local_130[0] = pBVar25;
      local_110 = local_130[1];
      local_100 = litPtr + sVar9;
      sVar9 = BIT_initDStream(&local_1a0,srcBuffer,sVar10);
      pZVar23 = local_1b0;
      if (0xffffffffffffff88 < sVar9) {
        return 0xffffffffffffffec;
      }
      ZSTD_initFseState(&local_178,&local_1a0,local_1b0->LLTptr);
      ZSTD_initFseState(&local_168,&local_1a0,pZVar23->OFTptr);
      ZSTD_initFseState(&local_158,&local_1a0,pZVar23->MLTptr);
      ppBVar31 = &sequences[0].match;
      local_d4 = iVar7;
      for (uVar28 = 0;
          (BVar5 = BIT_reloadDStream(&local_1a0), uVar17 = local_148[1],
          BVar5 != BIT_DStream_overflow && ((long)uVar28 < (long)iVar7)); uVar28 = uVar28 + 1) {
        bVar13 = local_178.table[local_178.state].nbAdditionalBits;
        bVar1 = local_158.table[local_158.state].nbAdditionalBits;
        bVar2 = local_168.table[local_168.state].nbAdditionalBits;
        uVar26 = local_178.table[local_178.state].baseValue;
        uVar8 = local_158.table[local_158.state].baseValue;
        uVar18 = (uint)bVar2;
        if (bVar2 == 0) {
          uVar27 = 0;
LAB_003ce368:
          lVar11 = ((ulong)uVar26 == 0) + uVar27;
          if (lVar11 != 0) {
            if (lVar11 == 3) {
              uVar27 = (local_148[0] - 1) + (ulong)(local_148[0] == 1);
LAB_003ce3b1:
              local_148[2] = local_148[1];
            }
            else {
              uVar27 = local_148[lVar11] + (ulong)(local_148[lVar11] == 0);
              if (lVar11 != 1) goto LAB_003ce3b1;
            }
            local_148[1] = local_148[0];
            goto LAB_003ce3d1;
          }
        }
        else {
          uVar27 = ((local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >>
                   (-bVar2 & 0x3f)) + (ulong)local_168.table[local_168.state].baseValue;
          local_1a0.bitsConsumed = local_1a0.bitsConsumed + uVar18;
          if (uVar18 == 1) goto LAB_003ce368;
          local_148[1] = local_148[0];
          local_148[2] = uVar17;
LAB_003ce3d1:
          local_148[1] = local_148[0];
          local_148[0] = uVar27;
        }
        uVar17 = local_148[0];
        if (bVar1 == 0) {
          uVar27 = 0;
        }
        else {
          uVar27 = (local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >>
                   (-bVar1 & 0x3f);
          local_1a0.bitsConsumed = local_1a0.bitsConsumed + bVar1;
        }
        if (0x1e < (uint)bVar1 + (uint)bVar13 + uVar18) {
          BIT_reloadDStream(&local_1a0);
        }
        if (bVar13 == 0) {
          uVar20 = 0;
        }
        else {
          uVar20 = (local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >>
                   (-bVar13 & 0x3f);
          local_1a0.bitsConsumed = local_1a0.bitsConsumed + bVar13;
        }
        sVar9 = uVar27 + uVar8;
        sVar10 = uVar20 + uVar26;
        uVar27 = local_120 + sVar10;
        pBVar15 = local_130[uVar27 < uVar17];
        local_120 = uVar27 + sVar9;
        iVar6 = local_1a0.bitsConsumed + local_178.table[local_178.state].nbBits;
        local_178.state =
             (ulong)((uint)(local_1a0.bitContainer >> (-(char)iVar6 & 0x3fU)) &
                    BIT_mask[local_178.table[local_178.state].nbBits]) +
             (ulong)local_178.table[local_178.state].nextState;
        iVar6 = iVar6 + (uint)local_158.table[local_158.state].nbBits;
        local_158.state =
             (ulong)((uint)(local_1a0.bitContainer >> (-(char)iVar6 & 0x3fU)) &
                    BIT_mask[local_158.table[local_158.state].nbBits]) +
             (ulong)local_158.table[local_158.state].nextState;
        local_1a0.bitsConsumed = iVar6 + (uint)local_168.table[local_168.state].nbBits;
        local_168.state =
             (ulong)((uint)(local_1a0.bitContainer >> (-(char)local_1a0.bitsConsumed & 0x3fU)) &
                    BIT_mask[local_168.table[local_168.state].nbBits]) +
             (ulong)local_168.table[local_168.state].nextState;
        ((seq_t *)(ppBVar31 + -3))->litLength = sVar10;
        ppBVar31[-2] = (BYTE *)sVar9;
        ppBVar31[-1] = (BYTE *)uVar17;
        *ppBVar31 = pBVar15 + (uVar27 - uVar17);
        ppBVar31 = ppBVar31 + 4;
      }
      if ((long)uVar28 < (long)iVar7) {
        return 0xffffffffffffffec;
      }
      local_f8 = pBVar24 + -8;
      local_d0 = pBVar24 + -0xd;
      local_1c8 = local_1a8;
      while( true ) {
        pBVar15 = local_1a8;
        BVar5 = BIT_reloadDStream(&local_1a0);
        uVar17 = local_148[1];
        uVar26 = (uint)uVar28;
        if ((BVar5 == BIT_DStream_overflow) || (nbSeq <= (int)uVar26)) break;
        bVar13 = local_178.table[local_178.state].nbAdditionalBits;
        bVar1 = local_158.table[local_158.state].nbAdditionalBits;
        bVar2 = local_168.table[local_168.state].nbAdditionalBits;
        uVar8 = local_178.table[local_178.state].baseValue;
        uVar18 = local_158.table[local_158.state].baseValue;
        uVar19 = (uint)bVar2;
        if (bVar2 == 0) {
          uVar28 = 0;
LAB_003ce67d:
          lVar11 = ((ulong)uVar8 == 0) + uVar28;
          if (lVar11 != 0) {
            if (lVar11 == 3) {
              uVar28 = (local_148[0] - 1) + (ulong)(local_148[0] == 1);
LAB_003ce6c6:
              local_148[2] = local_148[1];
            }
            else {
              uVar28 = local_148[lVar11] + (ulong)(local_148[lVar11] == 0);
              if (lVar11 != 1) goto LAB_003ce6c6;
            }
            local_148[1] = local_148[0];
            goto LAB_003ce6e6;
          }
        }
        else {
          uVar28 = ((local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >>
                   (-bVar2 & 0x3f)) + (ulong)local_168.table[local_168.state].baseValue;
          local_1a0.bitsConsumed = local_1a0.bitsConsumed + uVar19;
          if (uVar19 == 1) goto LAB_003ce67d;
          local_148[1] = local_148[0];
          local_148[2] = uVar17;
LAB_003ce6e6:
          local_148[1] = local_148[0];
          local_148[0] = uVar28;
        }
        uVar28 = local_148[0];
        if (bVar1 == 0) {
          uVar17 = 0;
        }
        else {
          uVar17 = (local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >>
                   (-bVar1 & 0x3f);
          local_1a0.bitsConsumed = local_1a0.bitsConsumed + bVar1;
        }
        if (0x1e < (uint)bVar1 + (uint)bVar13 + uVar19) {
          BIT_reloadDStream(&local_1a0);
        }
        if (bVar13 == 0) {
          uVar27 = 0;
        }
        else {
          uVar27 = (local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >>
                   (-bVar13 & 0x3f);
          local_1a0.bitsConsumed = local_1a0.bitsConsumed + bVar13;
        }
        lVar11 = uVar17 + uVar18;
        lVar32 = uVar27 + uVar8;
        uVar27 = local_120 + lVar32;
        pBVar4 = local_130[uVar27 < uVar28];
        local_120 = uVar27 + lVar11;
        iVar7 = local_1a0.bitsConsumed + local_178.table[local_178.state].nbBits;
        local_178.state =
             (ulong)((uint)(local_1a0.bitContainer >> (-(char)iVar7 & 0x3fU)) &
                    BIT_mask[local_178.table[local_178.state].nbBits]) +
             (ulong)local_178.table[local_178.state].nextState;
        iVar7 = iVar7 + (uint)local_158.table[local_158.state].nbBits;
        local_158.state =
             (ulong)((uint)(local_1a0.bitContainer >> (-(char)iVar7 & 0x3fU)) &
                    BIT_mask[local_158.table[local_158.state].nbBits]) +
             (ulong)local_158.table[local_158.state].nextState;
        local_1a0.bitsConsumed = iVar7 + (uint)local_168.table[local_168.state].nbBits;
        local_168.state =
             (ulong)((uint)(local_1a0.bitContainer >> (-(char)local_1a0.bitsConsumed & 0x3fU)) &
                    BIT_mask[local_168.table[local_168.state].nbBits]) +
             (ulong)local_168.table[local_168.state].nextState;
        uVar20 = (ulong)((uVar26 & 3) << 5);
        uVar17 = *(ulong *)((long)&sequences[0].litLength + uVar20);
        sVar29 = *(size_t *)((long)&sequences[0].matchLength + uVar20);
        pBVar15 = local_1c8 + (long)(uVar17 + sVar29);
        if (pBVar24 < pBVar15) {
          return 0xffffffffffffffba;
        }
        pBVar22 = litPtr + uVar17;
        if (local_100 < pBVar22) {
          return 0xffffffffffffffec;
        }
        local_118 = (BYTE *)(uVar17 + sVar29);
        local_e8 = (long *)((long)&sequences[0].litLength + uVar20);
        pBVar30 = local_1c8 + uVar17;
        if (local_f8 < pBVar30) {
          sequence.matchLength = *(undefined8 *)((long)&sequences[0].matchLength + uVar20);
          sequence.litLength = *local_e8;
          sequence.offset = *(undefined8 *)((long)&sequences[0].offset + uVar20);
          sequence.match = *(BYTE **)((long)&sequences[0].match + uVar20);
          pBVar12 = (BYTE *)ZSTD_execSequenceLast7
                                      (local_1c8,pBVar24,sequence,&litPtr,local_100,pBVar25,local_f0
                                       ,local_110);
        }
        else {
          local_c8 = *(ulong *)((long)&sequences[0].offset + uVar20);
          pBVar21 = *(BYTE **)((long)&sequences[0].match + uVar20);
          *(undefined8 *)local_1c8 = *(undefined8 *)litPtr;
          if (8 < uVar17) {
            pBVar12 = local_1c8 + 8;
            do {
              litPtr = litPtr + 8;
              *(undefined8 *)pBVar12 = *(undefined8 *)litPtr;
              pBVar12 = pBVar12 + 8;
            } while (pBVar12 < pBVar30);
          }
          litPtr = pBVar22;
          if ((ulong)((long)pBVar30 - (long)pBVar25) < local_c8) {
            if ((ulong)((long)pBVar30 - (long)local_f0) < local_c8) {
              return 0xffffffffffffffec;
            }
            local_e0 = uVar28;
            if (local_110 < pBVar21 + sVar29) {
              local_c0 = (long)local_110 - (long)pBVar21;
              memmove(pBVar30,pBVar21,local_c0);
              pBVar30 = pBVar30 + local_c0;
              sVar29 = sVar29 - local_c0;
              uVar28 = local_e0;
              if ((pBVar30 <= local_f8) && (pBVar21 = pBVar25, 2 < sVar29)) goto LAB_003ce9e3;
              for (uVar8 = 0; uVar17 = (ulong)uVar8, pBVar12 = local_118, uVar17 < sVar29;
                  uVar8 = uVar8 + 1) {
                pBVar30[uVar17] = pBVar25[uVar17];
              }
            }
            else {
              memmove(pBVar30,pBVar21,sVar29);
              pBVar12 = local_118;
              uVar28 = local_e0;
            }
          }
          else {
LAB_003ce9e3:
            if (local_c8 < 8) {
              iVar7 = *(int *)(ZSTD_execSequence_dec64table + local_c8 * 4);
              *pBVar30 = *pBVar21;
              pBVar30[1] = pBVar21[1];
              pBVar30[2] = pBVar21[2];
              pBVar30[3] = pBVar21[3];
              pBVar22 = pBVar21 + *(uint *)(ZSTD_execSequence_dec32table + local_c8 * 4);
              pBVar21 = pBVar21 + ((ulong)*(uint *)(ZSTD_execSequence_dec32table + local_c8 * 4) -
                                  (long)iVar7);
              *(undefined4 *)(pBVar30 + 4) = *(undefined4 *)pBVar22;
            }
            else {
              *(undefined8 *)pBVar30 = *(undefined8 *)pBVar21;
            }
            pBVar22 = pBVar30 + 8;
            pBVar21 = pBVar21 + 8;
            pBVar12 = local_118;
            if (local_d0 < pBVar15) {
              pBVar30 = pBVar22;
              pBVar14 = pBVar21;
              if (pBVar22 < local_f8) {
                do {
                  *(undefined8 *)pBVar30 = *(undefined8 *)pBVar14;
                  pBVar30 = pBVar30 + 8;
                  pBVar14 = pBVar14 + 8;
                } while (pBVar30 < local_f8);
                pBVar21 = pBVar21 + ((long)local_f8 - (long)pBVar22);
                pBVar22 = local_f8;
              }
              for (; pBVar22 < pBVar15; pBVar22 = pBVar22 + 1) {
                BVar3 = *pBVar21;
                pBVar21 = pBVar21 + 1;
                *pBVar22 = BVar3;
              }
            }
            else {
              do {
                *(undefined8 *)pBVar22 = *(undefined8 *)pBVar21;
                pBVar22 = pBVar22 + 8;
                pBVar21 = pBVar21 + 8;
              } while (pBVar22 < pBVar30 + sVar29);
            }
          }
        }
        if ((BYTE *)0xffffffffffffff88 < pBVar12) {
          return (size_t)pBVar12;
        }
        *local_e8 = lVar32;
        local_e8[1] = lVar11;
        local_e8[2] = uVar28;
        local_e8[3] = (long)(pBVar4 + (uVar27 - uVar28));
        local_1c8 = local_1c8 + (long)pBVar12;
        uVar28 = (ulong)(uVar26 + 1);
      }
      if ((int)uVar26 < nbSeq) {
        return 0xffffffffffffffec;
      }
      pZVar23 = local_1b0;
      for (uVar26 = uVar26 - local_d4; (int)uVar26 < nbSeq; uVar26 = uVar26 + 1) {
        uVar27 = (ulong)((uVar26 & 3) << 5);
        uVar17 = *(ulong *)((long)&sequences[0].litLength + uVar27);
        sVar29 = *(size_t *)((long)&sequences[0].matchLength + uVar27);
        uVar28 = uVar17 + sVar29;
        pBVar4 = local_1c8 + uVar28;
        if (pBVar24 < pBVar4) {
          return 0xffffffffffffffba;
        }
        pBVar22 = litPtr + uVar17;
        if (local_100 < pBVar22) {
          return 0xffffffffffffffec;
        }
        pBVar30 = local_1c8 + uVar17;
        if (local_f8 < pBVar30) {
          sequence_01.matchLength = *(undefined8 *)((long)&sequences[0].matchLength + uVar27);
          sequence_01.litLength = *(undefined8 *)((long)&sequences[0].litLength + uVar27);
          sequence_01.offset = *(undefined8 *)((long)&sequences[0].offset + uVar27);
          sequence_01.match = *(BYTE **)((long)&sequences[0].match + uVar27);
          uVar28 = ZSTD_execSequenceLast7
                             (local_1c8,pBVar24,sequence_01,&litPtr,local_100,pBVar25,local_f0,
                              local_110);
          pZVar23 = local_1b0;
        }
        else {
          uVar20 = *(ulong *)((long)&sequences[0].offset + uVar27);
          pBVar21 = *(BYTE **)((long)&sequences[0].match + uVar27);
          *(undefined8 *)local_1c8 = *(undefined8 *)litPtr;
          if (8 < uVar17) {
            pBVar15 = local_1c8 + 8;
            do {
              litPtr = litPtr + 8;
              *(undefined8 *)pBVar15 = *(undefined8 *)litPtr;
              pBVar15 = pBVar15 + 8;
            } while (pBVar15 < pBVar30);
          }
          litPtr = pBVar22;
          if ((ulong)((long)pBVar30 - (long)pBVar25) < uVar20) {
            if ((ulong)((long)pBVar30 - (long)local_f0) < uVar20) {
              return 0xffffffffffffffec;
            }
            if (local_110 < pBVar21 + sVar29) {
              __n = (long)local_110 - (long)pBVar21;
              memmove(pBVar30,pBVar21,__n);
              pBVar30 = pBVar30 + __n;
              sVar29 = sVar29 - __n;
              pZVar23 = local_1b0;
              if ((pBVar30 <= local_f8) && (pBVar21 = pBVar25, 2 < sVar29)) goto LAB_003cf2e1;
              for (uVar8 = 0; uVar17 = (ulong)uVar8, pBVar15 = local_1a8, uVar17 < sVar29;
                  uVar8 = uVar8 + 1) {
                pBVar30[uVar17] = pBVar25[uVar17];
              }
            }
            else {
              memmove(pBVar30,pBVar21,sVar29);
              pBVar15 = local_1a8;
              pZVar23 = local_1b0;
            }
          }
          else {
LAB_003cf2e1:
            if (uVar20 < 8) {
              iVar7 = *(int *)(ZSTD_execSequence_dec64table + uVar20 * 4);
              *pBVar30 = *pBVar21;
              pBVar30[1] = pBVar21[1];
              pBVar30[2] = pBVar21[2];
              pBVar30[3] = pBVar21[3];
              pBVar15 = pBVar21 + *(uint *)(ZSTD_execSequence_dec32table + uVar20 * 4);
              pBVar21 = pBVar21 + ((ulong)*(uint *)(ZSTD_execSequence_dec32table + uVar20 * 4) -
                                  (long)iVar7);
              *(undefined4 *)(pBVar30 + 4) = *(undefined4 *)pBVar15;
            }
            else {
              *(undefined8 *)pBVar30 = *(undefined8 *)pBVar21;
            }
            pBVar22 = pBVar30 + 8;
            pBVar21 = pBVar21 + 8;
            pBVar15 = local_1a8;
            if (local_d0 < pBVar4) {
              pBVar30 = pBVar22;
              pBVar12 = pBVar21;
              if (pBVar22 < local_f8) {
                do {
                  *(undefined8 *)pBVar30 = *(undefined8 *)pBVar12;
                  pBVar30 = pBVar30 + 8;
                  pBVar12 = pBVar12 + 8;
                } while (pBVar30 < local_f8);
                pBVar21 = pBVar21 + ((long)local_f8 - (long)pBVar22);
                pBVar22 = local_f8;
              }
              for (; pBVar22 < pBVar4; pBVar22 = pBVar22 + 1) {
                BVar3 = *pBVar21;
                pBVar21 = pBVar21 + 1;
                *pBVar22 = BVar3;
              }
            }
            else {
              do {
                *(undefined8 *)pBVar22 = *(undefined8 *)pBVar21;
                pBVar22 = pBVar22 + 8;
                pBVar21 = pBVar21 + 8;
              } while (pBVar22 < pBVar30 + sVar29);
            }
          }
        }
        if (0xffffffffffffff88 < uVar28) {
          return uVar28;
        }
        local_1c8 = local_1c8 + uVar28;
      }
      for (lVar11 = 0; pBVar25 = local_100, lVar11 != 3; lVar11 = lVar11 + 1) {
        (pZVar23->entropy).rep[lVar11] = (U32)local_148[lVar11];
      }
    }
    sVar29 = (long)pBVar25 - (long)litPtr;
    if ((ulong)((long)pBVar24 - (long)local_1c8) < sVar29) {
      return 0xffffffffffffffba;
    }
    memcpy(local_1c8,litPtr,sVar29);
    return (size_t)(local_1c8 + (sVar29 - (long)pBVar15));
  }
LAB_003ceb82:
  pBVar25 = local_1a8 + dstCapacity;
  litPtr = local_1b0->litPtr;
  sVar9 = local_1b0->litSize;
  plVar16 = (long *)(litPtr + sVar9);
  if (nbSeq == 0) {
LAB_003cf459:
    sVar29 = (long)plVar16 - (long)litPtr;
    if ((ulong)((long)pBVar25 - (long)pBVar15) < sVar29) {
      return 0xffffffffffffffba;
    }
    memcpy(pBVar15,litPtr,sVar29);
    return (size_t)(pBVar15 + (sVar29 - (long)local_1a8));
  }
  pBVar24 = (BYTE *)local_1b0->prefixStart;
  local_100 = (BYTE *)local_1b0->virtualStart;
  local_110 = (BYTE *)local_1b0->dictEnd;
  local_1b0->fseEntropy = 1;
  for (lVar11 = -6; lVar11 != 0; lVar11 = lVar11 + 2) {
    *(ulong *)((long)local_130 + lVar11 * 4) =
         (ulong)*(uint *)((long)local_1b0->workspace + lVar11 * 2);
  }
  local_e8 = (long *)(litPtr + sVar9);
  sVar9 = BIT_initDStream(&local_1a0,srcBuffer,sVar10);
  pZVar23 = local_1b0;
  if (0xffffffffffffff88 < sVar9) {
    return 0xffffffffffffffec;
  }
  ZSTD_initFseState(&local_178,&local_1a0,local_1b0->LLTptr);
  ZSTD_initFseState(&local_168,&local_1a0,pZVar23->OFTptr);
  ZSTD_initFseState(&local_158,&local_1a0,pZVar23->MLTptr);
  pBVar4 = pBVar25 + -8;
  local_118 = pBVar25 + -0xd;
  iVar7 = nbSeq;
  do {
    BVar5 = BIT_reloadDStream(&local_1a0);
    if ((BVar5 == BIT_DStream_overflow) || (iVar7 == 0)) {
      if (iVar7 != 0) {
        return 0xffffffffffffffec;
      }
      for (lVar11 = 0; plVar16 = local_e8, lVar11 != 3; lVar11 = lVar11 + 1) {
        (local_1b0->entropy).rep[lVar11] = (U32)local_148[lVar11];
      }
      goto LAB_003cf459;
    }
    bVar13 = local_178.table[local_178.state].nbAdditionalBits;
    bVar1 = local_158.table[local_158.state].nbAdditionalBits;
    bVar2 = local_168.table[local_168.state].nbAdditionalBits;
    uVar26 = local_178.table[local_178.state].baseValue;
    uVar8 = local_158.table[local_158.state].baseValue;
    uVar18 = (uint)bVar2;
    if (bVar2 == 0) {
      uVar28 = 0;
LAB_003ced36:
      lVar11 = ((ulong)uVar26 == 0) + uVar28;
      if (lVar11 != 0) {
        if (lVar11 == 3) {
          uVar28 = (local_148[0] - 1) + (ulong)(local_148[0] == 1);
        }
        else {
          uVar28 = local_148[lVar11] + (ulong)(local_148[lVar11] == 0);
          if (lVar11 == 1) goto LAB_003ced9f;
        }
        local_148[2] = local_148[1];
        goto LAB_003ced9f;
      }
    }
    else {
      uVar28 = ((local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >> (-bVar2 & 0x3f)
               ) + (ulong)local_168.table[local_168.state].baseValue;
      local_1a0.bitsConsumed = local_1a0.bitsConsumed + uVar18;
      if (uVar18 == 1) goto LAB_003ced36;
      local_148[2] = local_148[1];
LAB_003ced9f:
      local_148[1] = local_148[0];
      local_148[0] = uVar28;
    }
    uVar28 = local_148[0];
    if (bVar1 == 0) {
      uVar17 = 0;
    }
    else {
      uVar17 = (local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >> (-bVar1 & 0x3f);
      local_1a0.bitsConsumed = local_1a0.bitsConsumed + bVar1;
    }
    if (0x1e < (uint)bVar1 + (uint)bVar13 + uVar18) {
      BIT_reloadDStream(&local_1a0);
    }
    if (bVar13 == 0) {
      uVar27 = 0;
    }
    else {
      uVar27 = (local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >> (-bVar13 & 0x3f)
      ;
      local_1a0.bitsConsumed = local_1a0.bitsConsumed + bVar13;
    }
    sVar29 = uVar17 + uVar8;
    iVar6 = local_1a0.bitsConsumed + local_178.table[local_178.state].nbBits;
    local_178.state =
         (ulong)((uint)(local_1a0.bitContainer >> (-(char)iVar6 & 0x3fU)) &
                BIT_mask[local_178.table[local_178.state].nbBits]) +
         (ulong)local_178.table[local_178.state].nextState;
    iVar6 = iVar6 + (uint)local_158.table[local_158.state].nbBits;
    sequences[0].litLength = uVar27 + uVar26;
    local_158.state =
         (ulong)((uint)(local_1a0.bitContainer >> (-(char)iVar6 & 0x3fU)) &
                BIT_mask[local_158.table[local_158.state].nbBits]) +
         (ulong)local_158.table[local_158.state].nextState;
    local_1a0.bitsConsumed = iVar6 + (uint)local_168.table[local_168.state].nbBits;
    local_168.state =
         (ulong)((uint)(local_1a0.bitContainer >> (-(char)local_1a0.bitsConsumed & 0x3fU)) &
                BIT_mask[local_168.table[local_168.state].nbBits]) +
         (ulong)local_168.table[local_168.state].nextState;
    uVar17 = sequences[0].litLength + sVar29;
    pBVar22 = pBVar15 + uVar17;
    if (pBVar25 < pBVar22) {
      return 0xffffffffffffffba;
    }
    plVar16 = (long *)(litPtr + sequences[0].litLength);
    if (local_e8 < plVar16) {
      return 0xffffffffffffffec;
    }
    pBVar30 = pBVar15 + sequences[0].litLength;
    sequences[0].matchLength = sVar29;
    sequences[0].offset = uVar28;
    if (pBVar4 < pBVar30) {
      sequence_00.matchLength = sVar29;
      sequence_00.litLength = sequences[0].litLength;
      sequence_00.offset = uVar28;
      sequence_00.match = sequences[0].match;
      uVar17 = ZSTD_execSequenceLast7
                         (pBVar15,pBVar25,sequence_00,&litPtr,(BYTE *)local_e8,pBVar24,local_100,
                          local_110);
    }
    else {
      *(undefined8 *)pBVar15 = *(undefined8 *)litPtr;
      if (8 < sequences[0].litLength) {
        pBVar21 = pBVar15 + 8;
        do {
          litPtr = litPtr + 8;
          *(undefined8 *)pBVar21 = *(undefined8 *)litPtr;
          pBVar21 = pBVar21 + 8;
        } while (pBVar21 < pBVar30);
      }
      pBVar21 = pBVar30 + -uVar28;
      litPtr = (BYTE *)plVar16;
      if ((ulong)((long)pBVar30 - (long)pBVar24) < uVar28) {
        if ((ulong)((long)pBVar30 - (long)local_100) < uVar28) {
          return 0xffffffffffffffec;
        }
        lVar11 = (long)(pBVar30 + -uVar28) - (long)pBVar24;
        pBVar21 = local_110 + lVar11;
        if (local_110 < pBVar21 + sVar29) {
          memmove(pBVar30,pBVar21,-lVar11);
          pBVar30 = pBVar30 + -lVar11;
          sequences[0].matchLength = sVar29 + lVar11;
          if ((pBVar30 <= pBVar4) && (pBVar21 = pBVar24, 2 < sequences[0].matchLength))
          goto LAB_003cf004;
          for (uVar26 = 0; uVar28 = (ulong)uVar26, uVar28 < sequences[0].matchLength;
              uVar26 = uVar26 + 1) {
            pBVar30[uVar28] = pBVar24[uVar28];
          }
        }
        else {
          memmove(pBVar30,pBVar21,sVar29);
        }
      }
      else {
LAB_003cf004:
        if (uVar28 < 8) {
          iVar6 = *(int *)(ZSTD_execSequence_dec64table + uVar28 * 4);
          *pBVar30 = *pBVar21;
          pBVar30[1] = pBVar21[1];
          pBVar30[2] = pBVar21[2];
          pBVar30[3] = pBVar21[3];
          pBVar12 = pBVar21 + *(uint *)(ZSTD_execSequence_dec32table + sequences[0].offset * 4);
          pBVar21 = pBVar21 + ((ulong)*(uint *)(ZSTD_execSequence_dec32table +
                                               sequences[0].offset * 4) - (long)iVar6);
          *(undefined4 *)(pBVar30 + 4) = *(undefined4 *)pBVar12;
        }
        else {
          *(undefined8 *)pBVar30 = *(undefined8 *)pBVar21;
        }
        pBVar12 = pBVar30 + 8;
        pBVar21 = pBVar21 + 8;
        if (local_118 < pBVar22) {
          pBVar30 = pBVar12;
          pBVar14 = pBVar21;
          if (pBVar12 < pBVar4) {
            do {
              *(undefined8 *)pBVar30 = *(undefined8 *)pBVar14;
              pBVar30 = pBVar30 + 8;
              pBVar14 = pBVar14 + 8;
            } while (pBVar30 < pBVar4);
            pBVar21 = pBVar21 + ((long)pBVar4 - (long)pBVar12);
            pBVar12 = pBVar4;
          }
          for (; pBVar12 < pBVar22; pBVar12 = pBVar12 + 1) {
            BVar3 = *pBVar21;
            pBVar21 = pBVar21 + 1;
            *pBVar12 = BVar3;
          }
        }
        else {
          do {
            *(undefined8 *)pBVar12 = *(undefined8 *)pBVar21;
            pBVar12 = pBVar12 + 8;
            pBVar21 = pBVar21 + 8;
          } while (pBVar12 < pBVar30 + sequences[0].matchLength);
        }
      }
    }
    pBVar15 = pBVar15 + uVar17;
    iVar7 = iVar7 + -1;
    if (0xffffffffffffff88 < uVar17) {
      return uVar17;
    }
  } while( true );
}

Assistant:

size_t
ZSTD_decompressBlock_internal(ZSTD_DCtx* dctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize, const int frame)
{   /* blockType == blockCompressed */
    const BYTE* ip = (const BYTE*)src;
    /* isLongOffset must be true if there are long offsets.
     * Offsets are long if they are larger than 2^STREAM_ACCUMULATOR_MIN.
     * We don't expect that to be the case in 64-bit mode.
     * In block mode, window size is not known, so we have to be conservative.
     * (note: but it could be evaluated from current-lowLimit)
     */
    ZSTD_longOffset_e const isLongOffset = (ZSTD_longOffset_e)(MEM_32bits() && (!frame || (dctx->fParams.windowSize > (1ULL << STREAM_ACCUMULATOR_MIN))));
    DEBUGLOG(5, "ZSTD_decompressBlock_internal (size : %u)", (U32)srcSize);

    if (srcSize >= ZSTD_BLOCKSIZE_MAX) return ERROR(srcSize_wrong);

    /* Decode literals section */
    {   size_t const litCSize = ZSTD_decodeLiteralsBlock(dctx, src, srcSize);
        DEBUGLOG(5, "ZSTD_decodeLiteralsBlock : %u", (U32)litCSize);
        if (ZSTD_isError(litCSize)) return litCSize;
        ip += litCSize;
        srcSize -= litCSize;
    }

    /* Build Decoding Tables */
    {
        /* These macros control at build-time which decompressor implementation
         * we use. If neither is defined, we do some inspection and dispatch at
         * runtime.
         */
#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        int usePrefetchDecoder = dctx->ddictIsCold;
#endif
        int nbSeq;
        size_t const seqHSize = ZSTD_decodeSeqHeaders(dctx, &nbSeq, ip, srcSize);
        if (ZSTD_isError(seqHSize)) return seqHSize;
        ip += seqHSize;
        srcSize -= seqHSize;

#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        if ( !usePrefetchDecoder
          && (!frame || (dctx->fParams.windowSize > (1<<24)))
          && (nbSeq>ADVANCED_SEQS) ) {  /* could probably use a larger nbSeq limit */
            U32 const shareLongOffsets = ZSTD_getLongOffsetsShare(dctx->OFTptr);
            U32 const minShare = MEM_64bits() ? 7 : 20; /* heuristic values, correspond to 2.73% and 7.81% */
            usePrefetchDecoder = (shareLongOffsets >= minShare);
        }
#endif

        dctx->ddictIsCold = 0;

#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        if (usePrefetchDecoder)
#endif
#ifndef ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT
            return ZSTD_decompressSequencesLong(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset);
#endif

#ifndef ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG
        /* else */
        return ZSTD_decompressSequences(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset);
#endif
    }
}